

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O3

int luaB_print(lua_State *L)

{
  uint uVar1;
  size_t in_RAX;
  char *__ptr;
  uint idx;
  bool bVar2;
  size_t l;
  size_t local_38;
  
  local_38 = in_RAX;
  uVar1 = lua_gettop(L);
  if (0 < (int)uVar1) {
    idx = 1;
    do {
      __ptr = luaL_tolstring(L,idx,&local_38);
      if (1 < idx) {
        fputc(9,_stdout);
      }
      fwrite(__ptr,1,local_38,_stdout);
      lua_settop(L,-2);
      bVar2 = idx != uVar1;
      idx = idx + 1;
    } while (bVar2);
  }
  fputc(10,_stdout);
  fflush(_stdout);
  return 0;
}

Assistant:

static int luaB_print (lua_State *L) {
  int n = lua_gettop(L);  /* number of arguments */
  int i;
  for (i = 1; i <= n; i++) {  /* for each argument */
    size_t l;
    const char *s = luaL_tolstring(L, i, &l);  /* convert it to string */
    if (i > 1)  /* not the first element? */
      lua_writestring("\t", 1);  /* add a tab before it */
    lua_writestring(s, l);  /* print it */
    lua_pop(L, 1);  /* pop result */
  }
  lua_writeline();
  return 0;
}